

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

void __thiscall
duckdb::QuantileSortTree::QuantileSortTree
          (QuantileSortTree *this,AggregateInputData *aggr_input_data,
          WindowPartitionInput *partition)

{
  FunctionData FVar1;
  ColumnDataScanState *pCVar2;
  _Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_> _Var3;
  TemplatedValidityMask<unsigned_long> *this_00;
  long *plVar4;
  sel_t *psVar5;
  idx_t iVar6;
  char cVar7;
  const_reference cVar8;
  bool bVar9;
  FunctionData *pFVar10;
  reference pvVar11;
  pointer pWVar12;
  reference vector;
  sel_t i;
  uint uVar13;
  long lVar14;
  ulong row_idx;
  long *local_1c8;
  QuantileSortTree *local_1c0;
  pointer local_1b8;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> local_1b0;
  vector<unsigned_long,_true> sort_idx;
  SelectionVector filter_sel;
  idx_t count;
  LogicalType local_160 [24];
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  BoundOrderModifier order_bys;
  DataChunk sort;
  ulong local_d8;
  ColumnDataScanState scan;
  
  (this->index_tree).
  super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>.
  super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false> =
       (_Head_base<0UL,_duckdb::WindowIndexTree_*,_false>)0x0;
  pCVar2 = *(ColumnDataScanState **)(partition + 8);
  scan.current_chunk_state.handles._M_h._M_buckets =
       &scan.current_chunk_state.handles._M_h._M_single_bucket;
  scan.current_chunk_state.handles._M_h._M_bucket_count = 1;
  scan.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  scan.current_chunk_state.handles._M_h._M_element_count = 0;
  scan.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  scan.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  scan.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  scan.current_chunk_state.properties = INVALID;
  scan.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  scan.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  scan.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0 = this;
  duckdb::DataChunk::DataChunk(&sort);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_148,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(partition + 0x18));
  duckdb::ColumnDataCollection::InitializeScan(pCVar2,&scan,&local_148,1);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_148);
  duckdb::ColumnDataCollection::InitializeScanChunk(pCVar2,(DataChunk *)&scan);
  pFVar10 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  duckdb::DataChunk::GetTypes();
  pvVar11 = vector<duckdb::LogicalType,_true>::get<true>
                      ((vector<duckdb::LogicalType,_true> *)&sort_idx,0);
  duckdb::LogicalType::LogicalType(local_160,pvVar11);
  duckdb::Value::Value((Value *)&order_bys,local_160);
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_1c8,(Value *)&order_bys)
  ;
  duckdb::Value::~Value((Value *)&order_bys);
  duckdb::LogicalType::~LogicalType(local_160);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&sort_idx);
  FVar1 = pFVar10[0x38];
  duckdb::BoundOrderModifier::BoundOrderModifier(&order_bys);
  plVar4 = local_1c8;
  local_1c8 = (long *)0x0;
  duckdb::BoundOrderByNode::BoundOrderByNode((BoundOrderByNode *)&sort_idx,(byte)FVar1 | 2,3);
  std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>
            (&order_bys.orders.
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
             (BoundOrderByNode *)&sort_idx);
  BoundOrderByNode::~BoundOrderByNode((BoundOrderByNode *)&sort_idx);
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
  }
  filter_sel.sel_vector = (sel_t *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&sort_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,1,
             (value_type_conflict1 *)&filter_sel,(allocator_type *)&count);
  count = *(idx_t *)(partition + 0x10);
  make_uniq<duckdb::WindowIndexTree,duckdb::ClientContext&,duckdb::BoundOrderModifier&,duckdb::vector<unsigned_long,true>&,unsigned_long_const&>
            ((duckdb *)&filter_sel,*(ClientContext **)partition,&order_bys,&sort_idx,&count);
  psVar5 = filter_sel.sel_vector;
  filter_sel.sel_vector = (sel_t *)0x0;
  _Var3.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl =
       (local_1c0->index_tree).
       super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
       .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>;
  (local_1c0->index_tree).
  super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>.
  super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false> =
       (_Head_base<0UL,_duckdb::WindowIndexTree_*,_false>)psVar5;
  if (_Var3.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl !=
      (WindowIndexTree *)0x0) {
    (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl
                + 8))();
    if (filter_sel.sel_vector != (sel_t *)0x0) {
      (**(code **)(*(long *)filter_sel.sel_vector + 8))();
    }
  }
  pWVar12 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
            ::operator->(&local_1c0->index_tree);
  (**(code **)(*(long *)pWVar12 + 0x10))(&local_1b0,pWVar12);
  local_1b8 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
              ::operator->((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                            *)&local_1b0);
  this_00 = *(TemplatedValidityMask<unsigned_long> **)(partition + 0x58);
  SelectionVector::SelectionVector(&filter_sel,0x800);
LAB_005d0caa:
  do {
    cVar7 = duckdb::ColumnDataCollection::Scan(pCVar2,(DataChunk *)&scan);
    iVar6 = scan.current_row_index;
    if (cVar7 == '\0') {
      duckdb::WindowMergeSortTreeLocalState::Sort();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&filter_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      if (local_1b0._M_head_impl != (WindowAggregatorState *)0x0) {
        (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&sort_idx);
      BoundOrderModifier::~BoundOrderModifier(&order_bys);
      if (local_1c8 != (long *)0x0) {
        (**(code **)(*local_1c8 + 8))();
      }
      duckdb::DataChunk::~DataChunk(&sort);
      ColumnDataScanState::~ColumnDataScanState(&scan);
      return;
    }
    if (this_00->validity_mask == (unsigned_long *)0x0) {
      cVar8 = vector<bool,_true>::get<true>((vector<bool,_true> *)(partition + 0x30),0);
      if (cVar8) {
        duckdb::WindowMergeSortTreeLocalState::SinkChunk(local_1b8,&sort,iVar6,0,0);
        goto LAB_005d0caa;
      }
    }
    vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)&sort,0);
    FlatVector::VerifyFlatVector(vector);
    lVar14 = 0;
    for (uVar13 = 0; row_idx = (ulong)uVar13, row_idx < local_d8; uVar13 = uVar13 + 1) {
      bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,iVar6 + row_idx);
      if (bVar9) {
        bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(vector + 0x28),row_idx);
        if (bVar9) {
          filter_sel.sel_vector[lVar14] = uVar13;
          lVar14 = lVar14 + 1;
        }
      }
    }
    duckdb::WindowMergeSortTreeLocalState::SinkChunk(local_1b8,&sort,iVar6,&filter_sel,lVar14);
  } while( true );
}

Assistant:

QuantileSortTree(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition) {
		// TODO: Two pass parallel sorting using Build
		auto &inputs = *partition.inputs;
		ColumnDataScanState scan;
		DataChunk sort;
		inputs.InitializeScan(scan, partition.column_ids);
		inputs.InitializeScanChunk(scan, sort);

		// Sort on the single argument
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();
		auto order_expr = make_uniq<BoundConstantExpression>(Value(sort.GetTypes()[0]));
		auto order_type = bind_data.desc ? OrderType::DESCENDING : OrderType::ASCENDING;
		BoundOrderModifier order_bys;
		order_bys.orders.emplace_back(BoundOrderByNode(order_type, OrderByNullType::NULLS_LAST, std::move(order_expr)));
		vector<column_t> sort_idx(1, 0);
		const auto count = partition.count;

		index_tree = make_uniq<WindowIndexTree>(partition.context, order_bys, sort_idx, count);
		auto index_state = index_tree->GetLocalState();
		auto &local_state = index_state->Cast<WindowIndexTreeLocalState>();

		//	Build the indirection array by scanning the valid indices
		const auto &filter_mask = partition.filter_mask;
		SelectionVector filter_sel(STANDARD_VECTOR_SIZE);
		while (inputs.Scan(scan, sort)) {
			const auto row_idx = scan.current_row_index;
			if (!filter_mask.AllValid() || !partition.all_valid[0]) {
				auto &key = sort.data[0];
				auto &validity = FlatVector::Validity(key);
				idx_t filtered = 0;
				for (sel_t i = 0; i < sort.size(); ++i) {
					if (filter_mask.RowIsValid(i + row_idx) && validity.RowIsValid(i)) {
						filter_sel[filtered++] = i;
					}
				}
				local_state.SinkChunk(sort, row_idx, filter_sel, filtered);
			} else {
				local_state.SinkChunk(sort, row_idx, nullptr, 0);
			}
		}
		local_state.Sort();
	}